

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

Status __thiscall
leveldb::TestEnv::GetChildren
          (TestEnv *this,string *dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  bool bVar1;
  iterator __position;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  
  (**(code **)(*(long *)dir->_M_string_length + 0x38))();
  if (((this->super_EnvWrapper).super_Env._vptr_Env == (_func_int **)0x0) &&
     ((dir->field_2)._M_local_buf[0] == '\x01')) {
    __position._M_current =
         (in_RCX->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    while (__position._M_current !=
           (in_RCX->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = std::operator==(__position._M_current,".");
      if (bVar1) {
LAB_0011af48:
        __position = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::erase(in_RCX,__position._M_current);
      }
      else {
        bVar1 = std::operator==(__position._M_current,"..");
        if (bVar1) goto LAB_0011af48;
        __position._M_current = __position._M_current + 1;
      }
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status GetChildren(const std::string& dir,
                     std::vector<std::string>* result) override {
    Status s = target()->GetChildren(dir, result);
    if (!s.ok() || !ignore_dot_files_) {
      return s;
    }

    std::vector<std::string>::iterator it = result->begin();
    while (it != result->end()) {
      if ((*it == ".") || (*it == "..")) {
        it = result->erase(it);
      } else {
        ++it;
      }
    }

    return s;
  }